

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogDerivativesStates
          (BeagleCPUImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          double *categoryWeights,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  uVar3 = this->kPatternCount;
  uVar4 = this->kCategoryCount;
  lVar13 = 0;
  pdVar6 = this->gTransitionMatrices[firstDerivativeIndex];
  for (uVar14 = 0; uVar14 != (~((int)uVar4 >> 0x1f) & uVar4); uVar14 = uVar14 + 1) {
    lVar15 = (long)this->kPartialsPaddedStateCount;
    uVar5 = this->kStateCount;
    pdVar7 = this->grandNumeratorDerivTmp;
    pdVar8 = this->grandDenominatorDerivTmp;
    pdVar12 = (double *)(lVar13 * lVar15 + (long)preOrderPartial);
    for (uVar11 = 0; uVar11 != (~((int)uVar3 >> 0x1f) & uVar3); uVar11 = uVar11 + 1) {
      auVar17 = ZEXT816(0) << 0x40;
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           preOrderPartial
           [(uVar14 * (long)(int)uVar3 + uVar11) * lVar15 + (long)(tipStates[uVar11] % (int)uVar5)];
      iVar10 = this->kMatrixSize * (int)uVar14 + tipStates[uVar11];
      for (uVar9 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar9; uVar9 = uVar9 + 1) {
        auVar19._8_8_ = 0;
        auVar19._0_8_ = pdVar6[iVar10];
        iVar10 = iVar10 + this->kTransPaddedStateCount;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = pdVar12[uVar9];
        auVar17 = vfmadd231sd_fma(auVar17,auVar19,auVar1);
      }
      pdVar12 = pdVar12 + lVar15;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = categoryWeights[uVar14];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pdVar7[uVar11];
      auVar17 = vfmadd213sd_fma(auVar17,auVar20,auVar2);
      pdVar7[uVar11] = auVar17._0_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = categoryWeights[uVar14];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = pdVar8[uVar11];
      auVar17 = vfmadd213sd_fma(auVar16,auVar18,auVar17);
      pdVar8[uVar11] = auVar17._0_8_;
    }
    lVar13 = lVar13 + (long)(int)uVar3 * 8;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesStates(const int *tipStates,
                                                                     const REALTYPE *preOrderPartial,
                                                                     const int firstDerivativeIndex,
                                                                     const int secondDerivativeIndex,
                                                                     const double *categoryRates,
                                                                     const REALTYPE *categoryWeights,
                                                                     double *outDerivatives,
                                                                     double *outSumDerivatives,
                                                                     double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            const int patternIndex = category * kPatternCount + pattern;
            const int state = tipStates[pattern];

            REALTYPE numerator = 0.0;
            REALTYPE denominator = preOrderPartial[patternIndex * kPartialsPaddedStateCount + (state % kStateCount)];
            // TODO (state % kStateCount) is not correct; should imply missing character
            // TODO See calcCrossProductsStates() for possible solution

            for (int k = 0; k < kStateCount; k++) {
                numerator += firstDerivMatrix[category * kMatrixSize + k * kTransPaddedStateCount + state] *
                             preOrderPartial[patternIndex * kPartialsPaddedStateCount + k];
            }

            grandNumeratorDerivTmp[pattern] += categoryWeights[category] * numerator;
            grandDenominatorDerivTmp[pattern] += categoryWeights[category] * denominator;
        }
    }
}